

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash_test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b780::Encode_FromStringUsingOutParam_Test::Encode_FromStringUsingOutParam_Test
          (Encode_FromStringUsingOutParam_Test *this)

{
  Encode_FromStringUsingOutParam_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Encode_FromStringUsingOutParam_Test_00189068;
  return;
}

Assistant:

TEST(Encode, FromStringUsingOutParam) {
	std::string hash = "8a173fd3e32c0fa78b90fe42d305f202244e2739";
	multihash::Bytes expected{
	    0x11, 0x14, 0x8a, 0x17, 0x3f, 0xd3, 0xe3, 0x2c, 0x0f, 0xa7, 0x8b,
	    0x90, 0xfe, 0x42, 0xd3, 0x05, 0xf2, 0x02, 0x24, 0x4e, 0x27, 0x39,
	};

	multihash::Bytes encoded;
	auto optErr = multihash::encode(hash, 0x11, encoded);
	ASSERT_FALSE(optErr) << "Expected no error. error: '" << optErr.value() << "'";

	EXPECT_EQ(expected, encoded);
}